

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rust.cpp
# Opt level: O3

int test_rust_dummy(ITesting *t)

{
  char cVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *__s;
  long lVar4;
  ulong uVar5;
  char ascii [18];
  char hexdump [82];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  code *local_1d8;
  code *local_1d0;
  char *local_1c0;
  char local_1b8 [32];
  char local_198 [96];
  char local_138 [264];
  
  puts("test_rust_dummy - Hello from C");
  printf("ITesting size=%zu\n",0x60);
  printf("t = %p\n",t);
  printf("t->Debug = %p\n",t->Debug);
  printf("AssertError: =  %p\n",t->AssertError);
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1d0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_rust.cpp:87:19)>
              ::_M_invoke;
  local_1d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_rust.cpp:87:19)>
              ::_M_manager;
  __s = local_198;
  lVar4 = 0;
  uVar5 = 0;
  pcVar3 = local_1b8;
  do {
    snprintf(__s,4,"%.2x ",(ulong)*(byte *)((long)&t->Debug + lVar4));
    cVar1 = *(char *)((long)&t->Debug + lVar4);
    if (cVar1 < ' ') {
      cVar1 = '.';
    }
    *pcVar3 = cVar1;
    pcVar3[1] = '\0';
    if ((~(uint)lVar4 & 0xf) == 0) {
      snprintf(local_138,0x100,"%.4x %s    %s",uVar5,local_198,local_1b8);
      local_1c0 = local_138;
      if (local_1d8 == (code *)0x0) {
        uVar2 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar2);
      }
      (*local_1d0)(&local_1e8,&local_1c0);
      uVar5 = (ulong)((int)uVar5 + 0x10);
      builtin_strncpy(local_1b8,"                  ",0x12);
      builtin_strncpy(local_198,
                      "                                                                                  "
                      ,0x52);
      __s = local_198;
      pcVar3 = local_1b8;
    }
    else {
      pcVar3 = pcVar3 + 1;
      if ((~(uint)lVar4 & 7) == 0) {
        __s[3] = ' ';
        __s = __s + 4;
      }
      else {
        __s = __s + 3;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x60);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,3);
  }
  return 0;
}

Assistant:

DLL_EXPORT int test_rust_dummy(ITesting *t) {
    printf("test_rust_dummy - Hello from C\n");
    printf("ITesting size=%zu\n",sizeof(ITesting));
    printf("t = %p\n", (void *)t);
    printf("t->Debug = %p\n", (void *)t->Debug);
    printf("AssertError: =  %p\n", (void *)t->AssertError);
    HexDumpToConsole(t, sizeof(ITesting));
    return kTR_Pass;
}